

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O2

int __thiscall CS248::OSDText::init(OSDText *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  GLuint program;
  GLint GVar2;
  ostream *poVar3;
  char *__dest;
  OSDText *this_00;
  string decoded;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string encoded;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->use_hdpi = SUB81(ctx,0);
  iVar1 = FT_Init_FreeType(this->ft);
  if (iVar1 == 0) {
    std::operator+(&local_40,&osdfont_base64_1_abi_cxx11_,&osdfont_base64_2_abi_cxx11_);
    std::operator+(&local_a0,&local_40,&osdfont_base64_3_abi_cxx11_);
    std::operator+(&local_80,&local_a0,&osdfont_base64_4_abi_cxx11_);
    std::operator+(&decoded,&local_80,&osdfont_base64_5_abi_cxx11_);
    std::operator+(&encoded,&decoded,&osdfont_base64_6_abi_cxx11_);
    std::__cxx11::string::~string((string *)&decoded);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_40);
    base64_decode(&decoded,&encoded);
    __dest = (char *)operator_new__(decoded._M_string_length);
    this->font = __dest;
    memcpy(__dest,decoded._M_dataplus._M_p,decoded._M_string_length);
    this_00 = (OSDText *)*this->ft;
    iVar1 = FT_New_Memory_Face(this_00,__dest,decoded._M_string_length,0,this->face);
    if (iVar1 == 0) {
      program = compile_shaders(this_00);
      this->program = program;
      iVar1 = -1;
      if (program != 0) {
        GVar2 = get_attribu(this_00,program,"coord");
        this->attribute_coord = GVar2;
        GVar2 = get_uniform(this_00,this->program,"tex");
        this->uniform_tex = GVar2;
        GVar2 = get_uniform(this_00,this->program,"color");
        this->uniform_color = GVar2;
        if (((GVar2 != -1) && (this->attribute_coord != -1)) && (this->uniform_tex != -1)) {
          (*__glewGenBuffers)(1,&this->vbo);
          iVar1 = 0;
          (*__glewGenVertexArrays)(1,&this->vertexAttribArray);
        }
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,this->font);
      poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
      poVar3 = std::operator<<(poVar3,"[CS248] ");
      poVar3 = std::operator<<(poVar3,"\x1b[0m");
      poVar3 = std::operator<<(poVar3,"Cannot open font");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::ostream::flush();
      iVar1 = -1;
    }
    std::__cxx11::string::~string((string *)&decoded);
    std::__cxx11::string::~string((string *)&encoded);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
    poVar3 = std::operator<<(poVar3,"[CS248] ");
    poVar3 = std::operator<<(poVar3,"\x1b[0m");
    poVar3 = std::operator<<(poVar3,"Cannot init freetype library");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int OSDText::init(bool use_hdpi) {

    this->use_hdpi = use_hdpi;

    // initialize font library
    if (FT_Init_FreeType(ft)) {
      out_err("Cannot init freetype library");
      return -1;
    }

    // decode font and keep in memory
    string encoded = osdfont_base64_1 + osdfont_base64_2 + osdfont_base64_3 
                      + osdfont_base64_4 + osdfont_base64_5 + osdfont_base64_6;
    string decoded = base64_decode(encoded);
    size_t size = decoded.size();
    font = new char[size];
    memcpy(font, decoded.c_str(), size);

    // initialize font face
    if (FT_New_Memory_Face(*ft, (const FT_Byte*) font, size, 0, face)) {
        cerr << font;
        out_err("Cannot open font");
        return -1;
    }

    // compile shaders
    program = compile_shaders();
    if (program) {
        attribute_coord = get_attribu ( program, "coord" );
        uniform_tex     = get_uniform ( program, "tex"   );
        uniform_color   = get_uniform ( program, "color" );
        if (attribute_coord == -1 || uniform_tex == -1 || uniform_color == -1) {
            return -1;
        }
    } else return -1;

    // create the vbo
    glGenBuffers(1, &vbo);

    // vertex array
    glGenVertexArrays(1, &vertexAttribArray);

    return 0;
}